

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSAtom JS_ValueToAtom(JSContext *ctx,JSValue val)

{
  JSRuntime *pJVar1;
  uint uVar2;
  ulong uVar3;
  JSValueUnion JVar4;
  uint32_t *puVar5;
  JSValue JVar6;
  
  JVar4 = val.u;
  if ((int)val.u._0_4_ < 0 || (int)val.tag != 0) {
    if ((int)val.tag == -8) {
      pJVar1 = ctx->rt;
      uVar2 = (uint)((ulong)*(undefined8 *)((long)JVar4.ptr + 4) >> 0x20);
      if (uVar2 >> 0x1e < 3) {
        puVar5 = (uint32_t *)
                 ((ulong)((pJVar1->atom_hash_size - 1U & uVar2) << 2) + (long)pJVar1->atom_hash);
        do {
          uVar3 = (ulong)*puVar5;
          puVar5 = &pJVar1->atom_array[uVar3]->hash_next;
        } while (pJVar1->atom_array[uVar3] != (JSAtomStruct *)JVar4.ptr);
      }
      else {
        uVar3 = (ulong)*(uint32_t *)((long)JVar4.ptr + 0xc);
      }
      uVar2 = (uint)uVar3;
      if (0xd1 < (int)uVar2) {
        (pJVar1->atom_array[uVar3]->header).ref_count =
             (pJVar1->atom_array[uVar3]->header).ref_count + 1;
      }
    }
    else {
      JVar6 = JS_ToStringInternal(ctx,val,1);
      JVar4 = JVar6.u;
      if ((int)JVar6.tag == 6) {
        uVar2 = 0;
      }
      else if ((int)JVar6.tag == -8) {
        uVar2 = (uint)((ulong)*(undefined8 *)((long)JVar4.ptr + 4) >> 0x20);
        if (uVar2 >> 0x1e < 3) {
          pJVar1 = ctx->rt;
          puVar5 = (uint32_t *)
                   ((ulong)((pJVar1->atom_hash_size - 1U & uVar2) << 2) + (long)pJVar1->atom_hash);
          do {
            uVar2 = *puVar5;
            puVar5 = &pJVar1->atom_array[uVar2]->hash_next;
          } while (pJVar1->atom_array[uVar2] != (JSString *)JVar4.ptr);
        }
        else {
          uVar2 = *(uint32_t *)((long)JVar4.ptr + 0xc);
        }
      }
      else {
        uVar2 = JS_NewAtomStr(ctx,(JSString *)JVar4.ptr);
      }
    }
  }
  else {
    uVar2 = val.u._0_4_ | 0x80000000;
  }
  return uVar2;
}

Assistant:

JSAtom JS_ValueToAtom(JSContext *ctx, JSValueConst val)
{
    JSAtom atom;
    uint32_t tag;
    tag = JS_VALUE_GET_TAG(val);
    if (tag == JS_TAG_INT &&
        (uint32_t)JS_VALUE_GET_INT(val) <= JS_ATOM_MAX_INT) {
        /* fast path for integer values */
        atom = __JS_AtomFromUInt32(JS_VALUE_GET_INT(val));
    } else if (tag == JS_TAG_SYMBOL) {
        JSAtomStruct *p = JS_VALUE_GET_PTR(val);
        atom = JS_DupAtom(ctx, js_get_atom_index(ctx->rt, p));
    } else {
        JSValue str;
        str = JS_ToPropertyKey(ctx, val);
        if (JS_IsException(str))
            return JS_ATOM_NULL;
        if (JS_VALUE_GET_TAG(str) == JS_TAG_SYMBOL) {
            atom = js_symbol_to_atom(ctx, str);
        } else {
            atom = JS_NewAtomStr(ctx, JS_VALUE_GET_STRING(str));
        }
    }
    return atom;
}